

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall
FormatterTest_UnmatchedBraces_Test::TestBody(FormatterTest_UnmatchedBraces_Test *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  AssertionResult gtest_ar_2;
  AssertionResult local_318;
  AssertHelper local_300 [2];
  undefined1 local_2f0 [16];
  AssertionResult local_2e0;
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  undefined1 *local_268;
  long lStack_260;
  undefined8 local_258;
  undefined1 local_250 [504];
  undefined4 local_58 [4];
  undefined4 local_48 [6];
  
  testing::AssertionSuccess();
  if (local_318.success_ == true) {
    local_300[0].data_ = (AssertHelperData *)local_2f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"invalid format string","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_58[0] = 0;
      lStack_260 = 0;
      local_270.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_258 = 500;
      format_str.size_ = 1;
      format_str.data_ = "{";
      args.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_58;
      args.types_ = fmt::v5::
                    format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ::TYPES;
      local_268 = local_250;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_270,format_str,args,(locale_ref)0x0);
      local_290[0] = local_280;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_290,local_268,local_268 + lStack_260);
      local_270.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_268 != local_250) {
        operator_delete(local_268);
      }
      if (local_290[0] != local_280) {
        operator_delete(local_290[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_318,
               (char (*) [93])
               "Expected: format(\"{\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_300[0].data_ != (AssertHelperData *)local_2f0) {
      operator_delete(local_300[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_270);
  if (local_318.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_318.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_300,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x2f1,pcVar2);
  testing::internal::AssertHelper::operator=(local_300,(Message *)&local_270);
  testing::internal::AssertHelper::~AssertHelper(local_300);
  if (local_270.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_270.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_270.ptr_ + 8))();
    }
    local_270.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_318.success_ == true) {
    local_300[0].data_ = (AssertHelperData *)local_2f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_300,"unmatched \'}\' in format string","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_48[0] = 0;
      lStack_260 = 0;
      local_270.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_258 = 500;
      format_str_00.size_ = 1;
      format_str_00.data_ = "}";
      args_00.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_48;
      args_00.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_268 = local_250;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_270,format_str_00,args_00,(locale_ref)0x0);
      local_2b0[0] = local_2a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2b0,local_268,local_268 + lStack_260);
      local_270.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_268 != local_250) {
        operator_delete(local_268);
      }
      if (local_2b0[0] != local_2a0) {
        operator_delete(local_2b0[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_318,
               (char (*) [93])
               "Expected: format(\"}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_300[0].data_ != (AssertHelperData *)local_2f0) {
      operator_delete(local_300[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_270);
  if (local_318.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((local_318.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_300,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x2f2,pcVar2);
  testing::internal::AssertHelper::operator=(local_300,(Message *)&local_270);
  testing::internal::AssertHelper::~AssertHelper(local_300);
  if (local_270.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_270.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_270.ptr_ + 8))();
    }
    local_270.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_2e0.success_ == true) {
    local_300[0].data_ = (AssertHelperData *)local_2f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"invalid format string","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_318.success_ = false;
      local_318._1_3_ = 0;
      lStack_260 = 0;
      local_270.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      local_258 = 500;
      format_str_01.size_ = 4;
      format_str_01.data_ = "{0{}";
      args_01.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_318;
      args_01.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           ::TYPES;
      local_268 = local_250;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_270,format_str_01,args_01,(locale_ref)0x0);
      local_2d0[0] = local_2c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d0,local_268,local_268 + lStack_260);
      local_270.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a8bf0;
      if (local_268 != local_250) {
        operator_delete(local_268);
      }
      if (local_2d0[0] != local_2c0) {
        operator_delete(local_2d0[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_2e0,
               (char (*) [96])
               "Expected: format(\"{0{}\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if (local_300[0].data_ != (AssertHelperData *)local_2f0) {
      operator_delete(local_300[0].data_);
    }
  }
  testing::Message::Message((Message *)&local_270);
  if (local_2e0.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = *(char **)local_2e0.message_.ptr_;
  }
  testing::internal::AssertHelper::AssertHelper
            (local_300,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x2f3,pcVar2);
  testing::internal::AssertHelper::operator=(local_300,(Message *)&local_270);
  testing::internal::AssertHelper::~AssertHelper(local_300);
  if (local_270.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_270.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_270.ptr_ + 8))();
    }
    local_270.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2e0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(FormatterTest, UnmatchedBraces) {
  EXPECT_THROW_MSG(format("{"), format_error, "invalid format string");
  EXPECT_THROW_MSG(format("}"), format_error, "unmatched '}' in format string");
  EXPECT_THROW_MSG(format("{0{}"), format_error, "invalid format string");
}